

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CmdParser.cpp
# Opt level: O2

string * __thiscall
pobr::utils::CmdParser::getFlagValue
          (string *__return_storage_ptr__,CmdParser *this,string *flagName)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  bool bVar2;
  long lVar3;
  long lVar4;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var5;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __it;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> fullFlagEq;
  
  std::operator+(&local_70,"--",flagName);
  std::operator+(&fullFlagEq,&local_70,"=");
  std::__cxx11::string::~string((string *)&local_70);
  __it._M_current =
       (this->arguments).
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (this->arguments).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar3 = (long)pbVar1 - (long)__it._M_current;
  local_70._M_dataplus._M_p = (pointer)&fullFlagEq;
  for (lVar4 = lVar3 >> 7; _Var5._M_current = __it._M_current, 0 < lVar4; lVar4 = lVar4 + -1) {
    bVar2 = __gnu_cxx::__ops::
            _Iter_pred<pobr::utils::CmdParser::getFlagValue(std::__cxx11::string_const&)const::$_0>
            ::operator()((_Iter_pred<pobr::utils::CmdParser::getFlagValue(std::__cxx11::string_const&)const::__0>
                          *)&local_70,__it);
    if (bVar2) goto LAB_0010d329;
    bVar2 = __gnu_cxx::__ops::
            _Iter_pred<pobr::utils::CmdParser::getFlagValue(std::__cxx11::string_const&)const::$_0>
            ::operator()((_Iter_pred<pobr::utils::CmdParser::getFlagValue(std::__cxx11::string_const&)const::__0>
                          *)&local_70,__it._M_current + 1);
    _Var5._M_current = __it._M_current + 1;
    if (bVar2) goto LAB_0010d329;
    bVar2 = __gnu_cxx::__ops::
            _Iter_pred<pobr::utils::CmdParser::getFlagValue(std::__cxx11::string_const&)const::$_0>
            ::operator()((_Iter_pred<pobr::utils::CmdParser::getFlagValue(std::__cxx11::string_const&)const::__0>
                          *)&local_70,__it._M_current + 2);
    _Var5._M_current = __it._M_current + 2;
    if (bVar2) goto LAB_0010d329;
    bVar2 = __gnu_cxx::__ops::
            _Iter_pred<pobr::utils::CmdParser::getFlagValue(std::__cxx11::string_const&)const::$_0>
            ::operator()((_Iter_pred<pobr::utils::CmdParser::getFlagValue(std::__cxx11::string_const&)const::__0>
                          *)&local_70,__it._M_current + 3);
    _Var5._M_current = __it._M_current + 3;
    if (bVar2) goto LAB_0010d329;
    __it._M_current = __it._M_current + 4;
    lVar3 = lVar3 + -0x80;
  }
  lVar3 = lVar3 >> 5;
  if (lVar3 != 1) {
    if (lVar3 != 2) {
      _Var5._M_current = pbVar1;
      if ((lVar3 != 3) ||
         (bVar2 = __gnu_cxx::__ops::
                  _Iter_pred<pobr::utils::CmdParser::getFlagValue(std::__cxx11::string_const&)const::$_0>
                  ::operator()((_Iter_pred<pobr::utils::CmdParser::getFlagValue(std::__cxx11::string_const&)const::__0>
                                *)&local_70,__it), _Var5._M_current = __it._M_current, bVar2))
      goto LAB_0010d329;
      _Var5._M_current = __it._M_current + 1;
    }
    bVar2 = __gnu_cxx::__ops::
            _Iter_pred<pobr::utils::CmdParser::getFlagValue(std::__cxx11::string_const&)const::$_0>
            ::operator()((_Iter_pred<pobr::utils::CmdParser::getFlagValue(std::__cxx11::string_const&)const::__0>
                          *)&local_70,_Var5);
    if (bVar2) goto LAB_0010d329;
    __it._M_current = _Var5._M_current + 1;
  }
  bVar2 = __gnu_cxx::__ops::
          _Iter_pred<pobr::utils::CmdParser::getFlagValue(std::__cxx11::string_const&)const::$_0>::
          operator()((_Iter_pred<pobr::utils::CmdParser::getFlagValue(std::__cxx11::string_const&)const::__0>
                      *)&local_70,__it);
  _Var5._M_current = pbVar1;
  if (bVar2) {
    _Var5._M_current = __it._M_current;
  }
LAB_0010d329:
  if (_Var5._M_current ==
      (this->arguments).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,"",(allocator *)&local_70);
  }
  else {
    std::__cxx11::string::find((string *)_Var5._M_current,(ulong)&fullFlagEq);
    std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)_Var5._M_current);
  }
  std::__cxx11::string::~string((string *)&fullFlagEq);
  return __return_storage_ptr__;
}

Assistant:

const std::string
CmdParser::getFlagValue(const std::string& flagName)
const
{
    auto fullFlagEq = "--" + flagName + "=";

    auto iter = std::find_if(
        this->arguments.begin(),
        this->arguments.end(),
        [&fullFlagEq](const std::string& argument) -> bool
        {
            return argument.find(fullFlagEq) != std::string::npos;
        }
    );

    if (iter == this->arguments.end()) {
        return "";
    }

    auto valIter = (*iter).find(fullFlagEq) + fullFlagEq.length();

    return (*iter).substr(valIter);
}